

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O1

void bubble_down(nghttp2_pq *pq,size_t index)

{
  nghttp2_pq_entry **ppnVar1;
  nghttp2_pq_entry *pnVar2;
  nghttp2_pq_entry *pnVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  
  do {
    uVar5 = index * 2;
    lVar6 = 1;
    sVar7 = index;
    do {
      uVar5 = uVar5 + 1;
      if (pq->length <= uVar5) break;
      iVar4 = (*pq->less)(pq->q[uVar5],pq->q[sVar7]);
      if (iVar4 != 0) {
        sVar7 = uVar5;
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 == 0);
    if (sVar7 == index) {
      return;
    }
    ppnVar1 = pq->q;
    pnVar2 = ppnVar1[index];
    pnVar3 = ppnVar1[sVar7];
    ppnVar1[index] = pnVar3;
    pnVar3->index = index;
    pq->q[sVar7] = pnVar2;
    pnVar2->index = sVar7;
    index = sVar7;
  } while( true );
}

Assistant:

static void bubble_down(nghttp2_pq *pq, size_t index) {
  size_t i, j, minindex;
  for (;;) {
    j = index * 2 + 1;
    minindex = index;
    for (i = 0; i < 2; ++i, ++j) {
      if (j >= pq->length) {
        break;
      }
      if (pq->less(pq->q[j], pq->q[minindex])) {
        minindex = j;
      }
    }
    if (minindex == index) {
      return;
    }
    swap(pq, index, minindex);
    index = minindex;
  }
}